

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InfoSink.h
# Opt level: O1

void __thiscall glslang::TInfoSinkBase::prefix(TInfoSinkBase *this,TPrefixType message)

{
  switch(message) {
  case EPrefixNone:
    return;
  case EPrefixWarning:
    append(this,"WARNING: ");
    return;
  case EPrefixError:
    append(this,"ERROR: ");
    return;
  case EPrefixInternalError:
    append(this,"INTERNAL ERROR: ");
    return;
  case EPrefixUnimplemented:
    append(this,"UNIMPLEMENTED: ");
    return;
  case EPrefixNote:
    append(this,"NOTE: ");
    return;
  default:
    append(this,"UNKNOWN ERROR: ");
    return;
  }
}

Assistant:

void prefix(TPrefixType message) {
        switch(message) {
        case EPrefixNone:                                      break;
        case EPrefixWarning:       append("WARNING: ");        break;
        case EPrefixError:         append("ERROR: ");          break;
        case EPrefixInternalError: append("INTERNAL ERROR: "); break;
        case EPrefixUnimplemented: append("UNIMPLEMENTED: ");  break;
        case EPrefixNote:          append("NOTE: ");           break;
        default:                   append("UNKNOWN ERROR: ");   break;
        }
    }